

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_ws.cpp
# Opt level: O2

ScalarFunction * duckdb::ConcatWsFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf4;
  FunctionNullHandling in_stack_fffffffffffffe00;
  allocator_type local_1fa;
  allocator local_1f9;
  code *bind_lambda;
  LogicalType local_1d8;
  LogicalType local_1c0 [2];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_190;
  LogicalType local_178;
  string local_160;
  ScalarFunction concat_ws;
  
  ::std::__cxx11::string::string((string *)&local_160,"concat_ws",&local_1f9);
  LogicalType::LogicalType(local_1c0,VARCHAR);
  LogicalType::LogicalType(local_1c0 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_1c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_190,__l,&local_1fa);
  LogicalType::LogicalType(&local_1d8,VARCHAR);
  bind_lambda = ConcatWSFunction;
  LogicalType::LogicalType(&local_178,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_178;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffdec;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffdf4;
  ScalarFunction::ScalarFunction
            (&concat_ws,&local_160,(vector<duckdb::LogicalType,_true> *)&local_190,&local_1d8,
             (scalar_function_t *)&stack0xfffffffffffffe08,BindConcatWSFunction,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffe00,bind_lambda);
  LogicalType::~LogicalType(&local_178);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe08);
  LogicalType::~LogicalType(&local_1d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_190);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_1c0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_160);
  LogicalType::LogicalType(local_1c0,ANY);
  LogicalType::operator=(&concat_ws.super_BaseScalarFunction.super_SimpleFunction.varargs,local_1c0)
  ;
  LogicalType::~LogicalType(local_1c0);
  concat_ws.super_BaseScalarFunction.null_handling = SPECIAL_HANDLING;
  ScalarFunction::ScalarFunction(in_RDI,&concat_ws);
  ScalarFunction::~ScalarFunction(&concat_ws);
  return in_RDI;
}

Assistant:

ScalarFunction ConcatWsFun::GetFunction() {
	// concat_ws functions similarly to the concat function, except the result is NULL if the separator is NULL
	// if the separator is not NULL, however, NULL values are counted as empty string
	// there is one separate rule: there are no separators added between NULL values,
	// so the NULL value and empty string are different!
	// e.g.:
	// concat_ws(',', NULL, NULL) = ""
	// concat_ws(',', '', '') = ","

	ScalarFunction concat_ws = ScalarFunction("concat_ws", {LogicalType::VARCHAR, LogicalType::ANY},
	                                          LogicalType::VARCHAR, ConcatWSFunction, BindConcatWSFunction);
	concat_ws.varargs = LogicalType::ANY;
	concat_ws.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return ScalarFunction(concat_ws);
}